

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::orientationReset
          (DeadReckoningCalculator *this,EulerAngles *Orientation)

{
  undefined8 uVar1;
  KFLOAT32 KVar2;
  KFLOAT32 __x;
  KFLOAT32 __x_00;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  (this->m_initOrientation).m_f32Phi = Orientation->m_f32Phi;
  KVar2 = Orientation->m_f32Theta;
  (this->m_initOrientation).m_f32Psi = Orientation->m_f32Psi;
  (this->m_initOrientation).m_f32Theta = KVar2;
  KVar2 = DATA_TYPE::EulerAngles::GetPsiInRadians(Orientation);
  __x = DATA_TYPE::EulerAngles::GetThetaInRadians(Orientation);
  __x_00 = DATA_TYPE::EulerAngles::GetPhiInRadians(Orientation);
  fVar3 = cosf((float)KVar2);
  fVar4 = cosf((float)__x);
  fVar5 = cosf((float)__x_00);
  fVar6 = sinf((float)KVar2);
  fVar7 = sinf((float)__x);
  fVar8 = sinf((float)__x_00);
  *(ulong *)(this->m_initOrientationMatrix).Data[0] = CONCAT44(fVar6 * fVar4,fVar3 * fVar4);
  (this->m_initOrientationMatrix).Data[0][2] = -fVar7;
  (this->m_initOrientationMatrix).Data[1][2] = fVar4 * fVar8;
  *(ulong *)(this->m_initOrientationMatrix).Data[1] =
       CONCAT44(fVar8 * fVar7 * fVar6 + fVar3 * fVar5,fVar8 * fVar3 * fVar7 + -fVar5 * fVar6);
  *(ulong *)(this->m_initOrientationMatrix).Data[2] =
       CONCAT44(fVar5 * fVar7 * fVar6 + -fVar8 * fVar3,fVar5 * fVar3 * fVar7 + fVar6 * fVar8);
  (this->m_initOrientationMatrix).Data[2][2] = fVar4 * fVar5;
  (this->m_initOrientationMatrixTranspose).Data[2][2] = (this->m_initOrientationMatrix).Data[2][2];
  uVar1 = *(undefined8 *)((this->m_initOrientationMatrix).Data[0] + 2);
  *(undefined8 *)(this->m_initOrientationMatrixTranspose).Data[0] =
       *(undefined8 *)(this->m_initOrientationMatrix).Data[0];
  *(undefined8 *)((this->m_initOrientationMatrixTranspose).Data[0] + 2) = uVar1;
  uVar1 = *(undefined8 *)(this->m_initOrientationMatrix).Data[2];
  *(undefined8 *)((this->m_initOrientationMatrixTranspose).Data[1] + 1) =
       *(undefined8 *)((this->m_initOrientationMatrix).Data[1] + 1);
  *(undefined8 *)(this->m_initOrientationMatrixTranspose).Data[2] = uVar1;
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::inPlanceTranspose
            (&this->m_initOrientationMatrixTranspose);
  computeRotationAxis(this,&this->m_initOrientationMatrix);
  return;
}

Assistant:

void DeadReckoningCalculator::orientationReset( const EulerAngles & Orientation )
{
    m_initOrientation = Orientation;

    const KFLOAT32 f32Psi = Orientation.GetPsiInRadians();
    const KFLOAT32 f32Theta = Orientation.GetThetaInRadians();
    const KFLOAT32 f32Phi = Orientation.GetPhiInRadians();

    const KFLOAT64 f32CosPsi = cos( f32Psi );
    const KFLOAT64 f32CosTheta = cos( f32Theta );
    const KFLOAT64 f32CosPhi = cos( f32Phi );
    const KFLOAT64 f32SinPsi = sin( f32Psi );
    const KFLOAT64 f32SinTheta = sin( f32Theta );
    const KFLOAT64 f32SinPhi = sin( f32Phi );

    // Create the orientation matrix

    // RI - could use osg mathematics for Euler to rotation matrix computation
    const KFLOAT64 sinTheta_cosPsi = f32SinTheta * f32CosPsi;
    const KFLOAT64 sinTheta_sinPsi = f32SinTheta * f32SinPsi;

    m_initOrientationMatrix.Data[0][0] = f32CosTheta * f32CosPsi;
    m_initOrientationMatrix.Data[0][1] = f32CosTheta * f32SinPsi;
    m_initOrientationMatrix.Data[0][2] = -f32SinTheta;

    m_initOrientationMatrix.Data[1][0] = ( f32SinPhi * sinTheta_cosPsi ) - ( f32CosPhi * f32SinPsi );
    m_initOrientationMatrix.Data[1][1] = ( f32SinPhi * sinTheta_sinPsi ) + ( f32CosPhi * f32CosPsi );
    m_initOrientationMatrix.Data[1][2] = f32SinPhi * f32CosTheta;

    m_initOrientationMatrix.Data[2][0] = ( f32CosPhi * sinTheta_cosPsi ) + ( f32SinPhi * f32SinPsi );
    m_initOrientationMatrix.Data[2][1] = ( f32CosPhi * sinTheta_sinPsi ) - ( f32SinPhi * f32CosPsi );
    m_initOrientationMatrix.Data[2][2] = f32CosPhi * f32CosTheta;

    m_initOrientationMatrixTranspose = m_initOrientationMatrix;
    m_initOrientationMatrixTranspose.inPlanceTranspose();

    computeRotationAxis(m_initOrientationMatrix);
}